

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte> *this)

{
  CompositeCodec<FastPForLib::FastPFor<8U>,_FastPForLib::VariableByte> *in_RDI;
  
  ~CompositeCodec(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}